

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewParseTest.cpp
# Opt level: O1

void __thiscall badlywrapped<spair>::~badlywrapped(badlywrapped<spair> *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->value).second._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->value).second.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->value).first._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->value).first.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

badlywrapped() : value() {}